

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

void inverse_mdct(float *buffer,int n,vorb *f,int blocktype)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  undefined4 extraout_var;
  float *pfVar9;
  uint uVar10;
  float *pfVar11;
  ushort *puVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  int iVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  ulong local_b8;
  vorb *local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  int local_8c;
  int local_88;
  int local_84;
  float *local_80;
  ulong local_78;
  int a_off;
  undefined1 local_68 [16];
  ulong local_58;
  ulong local_50;
  int local_44;
  float *local_40;
  int local_34;
  
  local_68._8_8_ = local_68._0_8_;
  pfVar17 = (float *)&local_b8;
  uVar10 = n >> 1;
  local_50 = (ulong)uVar10;
  local_88 = f->temp_offset;
  local_40 = buffer;
  local_34 = n;
  if ((f->alloc).alloc_buffer == (char *)0x0) {
    pfVar17 = (float *)((long)&local_b8 - ((long)(int)uVar10 * 4 + 0xfU & 0xfffffffffffffff0));
    _a_off = pfVar17;
  }
  else {
    _a_off = (float *)setup_temp_malloc(f,uVar10 * 4);
  }
  iVar16 = local_34;
  lVar22 = (long)(int)uVar10;
  iVar21 = local_34 >> 2;
  pfVar14 = f->A[(uint)blocktype];
  local_68._0_8_ = pfVar14;
  pfVar11 = pfVar14;
  pfVar9 = local_40;
  lVar20 = (long)(int)uVar10 * 4;
  for (lVar13 = lVar22 * 4; lVar8 = lVar20 + -8, lVar13 != 0; lVar13 = lVar13 + -0x10) {
    *(float *)((long)_a_off + lVar20 + -4) = *pfVar9 * *pfVar11 - pfVar11[1] * pfVar9[2];
    *(float *)((long)_a_off + lVar8) = *pfVar9 * pfVar11[1] + pfVar9[2] * *pfVar11;
    pfVar11 = pfVar11 + 2;
    pfVar9 = pfVar9 + 4;
    lVar20 = lVar8;
  }
  lVar13 = lVar22 * 4 + -4;
  for (lVar18 = 0; _a_off <= (float *)((long)_a_off + lVar18 + lVar8); lVar18 = lVar18 + -8) {
    *(float *)((long)_a_off + lVar20 + -4 + lVar18) =
         *(float *)((long)local_40 + lVar18 * 2 + lVar22 * 4 + -0xc) * pfVar11[1] -
         *(float *)((long)local_40 + lVar18 * 2 + lVar13) * *pfVar11;
    *(float *)((long)_a_off + lVar8 + lVar18) =
         -*(float *)((long)local_40 + lVar18 * 2 + lVar13) * pfVar11[1] -
         *pfVar11 * *(float *)((long)local_40 + lVar18 * 2 + lVar22 * 4 + -0xc);
    pfVar11 = pfVar11 + 2;
  }
  local_a0 = (long)iVar21;
  lVar13 = 0;
  pfVar11 = pfVar14 + lVar22;
  while (pfVar9 = pfVar11 + -8, pfVar14 <= pfVar9) {
    fVar27 = *(float *)((long)_a_off + lVar13 + local_a0 * 4 + 4);
    fVar25 = *(float *)((long)_a_off + lVar13 + 4);
    fVar26 = fVar27 - fVar25;
    fVar24 = *(float *)((long)_a_off + lVar13 + local_a0 * 4) - *(float *)((long)_a_off + lVar13);
    *(float *)((long)local_40 + lVar13 + local_a0 * 4 + 4) = fVar27 + fVar25;
    *(float *)((long)local_40 + lVar13 + local_a0 * 4) =
         *(float *)((long)_a_off + lVar13 + local_a0 * 4) + *(float *)((long)_a_off + lVar13);
    *(float *)((long)local_40 + lVar13 + 4) = pfVar11[-4] * fVar26 - pfVar11[-3] * fVar24;
    *(float *)((long)local_40 + lVar13) = fVar24 * pfVar11[-4] + fVar26 * pfVar11[-3];
    fVar27 = *(float *)((long)_a_off + lVar13 + local_a0 * 4 + 0xc);
    fVar25 = *(float *)((long)_a_off + lVar13 + 0xc);
    fVar24 = *(float *)((long)_a_off + lVar13 + local_a0 * 4 + 8) -
             *(float *)((long)_a_off + lVar13 + 8);
    *(float *)((long)local_40 + lVar13 + local_a0 * 4 + 0xc) = fVar27 + fVar25;
    fVar27 = fVar27 - fVar25;
    *(float *)((long)local_40 + lVar13 + local_a0 * 4 + 8) =
         *(float *)((long)_a_off + lVar13 + local_a0 * 4 + 8) +
         *(float *)((long)_a_off + lVar13 + 8);
    *(float *)((long)local_40 + lVar13 + 0xc) = *pfVar9 * fVar27 - pfVar11[-7] * fVar24;
    *(float *)((long)local_40 + lVar13 + 8) = fVar24 * *pfVar9 + fVar27 * pfVar11[-7];
    lVar13 = lVar13 + 0x10;
    pfVar11 = pfVar9;
  }
  local_b0 = f;
  local_a8 = (ulong)(uint)blocktype;
  local_98 = lVar22;
  local_78 = (ulong)(uint)(local_34 >> 3);
  pfVar17[-2] = 1.64854e-39;
  pfVar17[-1] = 0.0;
  iVar7 = ilog(iVar16);
  pfVar14 = local_40;
  local_58 = CONCAT44(extraout_var,iVar7);
  iVar16 = iVar16 >> 4;
  iVar7 = (int)local_50 + -1;
  iVar23 = (int)local_78;
  uVar5 = local_68._0_8_;
  local_44 = iVar7;
  pfVar17[-2] = 1.648611e-39;
  pfVar17[-1] = 0.0;
  imdct_step3_iter0_loop(iVar16,pfVar14,iVar7,-iVar23,(float *)uVar5);
  iVar7 = (int)local_50;
  pfVar17[-2] = 1.648651e-39;
  pfVar17[-1] = 0.0;
  imdct_step3_iter0_loop(iVar16,pfVar14,(iVar7 - iVar21) + -1,-iVar23,(float *)uVar5);
  iVar23 = local_34 >> 5;
  iVar16 = -iVar16;
  pfVar17[-2] = 2.24208e-44;
  iVar21 = local_44;
  pfVar17[-1] = 0.0;
  uVar4 = *(undefined8 *)(pfVar17 + -2);
  pfVar17[-2] = 1.648703e-39;
  pfVar17[-1] = 0.0;
  imdct_step3_inner_r_loop(iVar23,pfVar14,iVar21,iVar16,(float *)uVar5,(int)uVar4);
  iVar7 = (int)local_78;
  pfVar17[-2] = 2.24208e-44;
  pfVar17[-1] = 0.0;
  uVar4 = *(undefined8 *)(pfVar17 + -2);
  pfVar17[-2] = 1.648745e-39;
  pfVar17[-1] = 0.0;
  imdct_step3_inner_r_loop(iVar23,pfVar14,iVar21 - iVar7,iVar16,(float *)uVar5,(int)uVar4);
  iVar21 = local_44 + iVar7 * -2;
  pfVar17[-2] = 2.24208e-44;
  pfVar17[-1] = 0.0;
  uVar4 = *(undefined8 *)(pfVar17 + -2);
  pfVar17[-2] = 1.648786e-39;
  pfVar17[-1] = 0.0;
  imdct_step3_inner_r_loop(iVar23,pfVar14,iVar21,iVar16,(float *)uVar5,(int)uVar4);
  iVar21 = (int)local_50;
  local_84 = iVar23;
  pfVar17[-2] = 2.24208e-44;
  pfVar17[-1] = 0.0;
  uVar4 = *(undefined8 *)(pfVar17 + -2);
  pfVar17[-2] = 1.648838e-39;
  pfVar17[-1] = 0.0;
  imdct_step3_inner_r_loop(iVar23,pfVar14,iVar7 * -3 + iVar21 + -1,iVar16,(float *)uVar5,(int)uVar4)
  ;
  local_8c = (int)local_58 + -4 >> 1;
  pfVar17[-2] = 2.8026e-45;
  pfVar17[-1] = 0.0;
  uVar19 = *(ulong *)(pfVar17 + -2) & 0xffffffff;
  while (iVar16 = local_34, (int)uVar19 < local_8c) {
    bVar6 = (byte)uVar19;
    iVar23 = local_34 >> (bVar6 + 2 & 0x1f);
    pfVar17[-2] = 2.8026e-45;
    pfVar17[-1] = 0.0;
    uVar4 = *(undefined8 *)(pfVar17 + -2);
    local_80 = (float *)CONCAT44(local_80._4_4_,iVar23);
    pfVar17[-2] = 1.12104e-44;
    pfVar17[-1] = 0.0;
    uVar5 = *(undefined8 *)(pfVar17 + -2);
    local_b8 = uVar19;
    iVar7 = local_44;
    iVar21 = (int)uVar4 << (bVar6 & 0x1f);
    if ((int)uVar4 << (bVar6 & 0x1f) < 1) {
      iVar21 = 0;
    }
    while (pfVar14 = local_40, iVar21 != 0) {
      uVar4 = local_68._0_8_;
      pfVar17[-2] = 1.649024e-39;
      pfVar17[-1] = 0.0;
      imdct_step3_inner_r_loop
                (iVar16 >> (bVar6 + 4 & 0x1f),pfVar14,iVar7,-(iVar23 >> 1),(float *)uVar4,
                 (int)uVar5 << (bVar6 & 0x1f));
      iVar7 = iVar7 - (int)local_80;
      iVar21 = iVar21 + -1;
    }
    uVar19 = (ulong)((int)local_b8 + 1);
  }
  local_58 = (ulong)((int)local_58 - 7);
  local_80 = local_40 + local_98 + -2;
  while( true ) {
    iVar21 = local_34;
    iVar16 = local_88;
    if ((int)local_58 <= (int)uVar19) break;
    bVar6 = (byte)uVar19;
    iVar16 = local_34 >> (bVar6 + 2 & 0x1f);
    pfVar17[-2] = 1.12104e-44;
    pfVar17[-1] = 0.0;
    uVar4 = *(undefined8 *)(pfVar17 + -2);
    iVar21 = iVar21 >> (bVar6 + 6 & 0x1f);
    pfVar17[-2] = 2.8026e-45;
    pfVar17[-1] = 0.0;
    uVar5 = *(undefined8 *)(pfVar17 + -2);
    pfVar17[-2] = 2.24208e-44;
    pfVar17[-1] = 0.0;
    iVar7 = (int)*(undefined8 *)(pfVar17 + -2) << (bVar6 & 0x1f);
    lVar13 = (long)((int)uVar4 << (bVar6 & 0x1f));
    pfVar17[-2] = 3.36312e-44;
    pfVar17[-1] = 0.0;
    lVar22 = (long)((int)*(undefined8 *)(pfVar17 + -2) << (bVar6 & 0x1f));
    pfVar17[-2] = 4.48416e-44;
    pfVar17[-1] = 0.0;
    uVar4 = *(undefined8 *)(pfVar17 + -2);
    pfVar17[-2] = -NAN;
    pfVar17[-1] = -NAN;
    lVar20 = *(long *)(pfVar17 + -2) + (long)(iVar16 >> 1) * -4;
    pfVar11 = local_80;
    pfVar14 = (float *)local_68._0_8_;
    for (; 0 < iVar21; iVar21 = iVar21 + -1) {
      fVar27 = pfVar14[lVar22];
      fVar25 = pfVar14[lVar22 + 1];
      fVar24 = pfVar14[iVar7];
      fVar26 = pfVar14[iVar7 + 1];
      fVar28 = pfVar14[lVar13];
      fVar29 = pfVar14[lVar13 + 1];
      fVar1 = *pfVar14;
      fVar2 = pfVar14[1];
      pfVar9 = pfVar11;
      for (iVar23 = (int)uVar5 << (bVar6 & 0x1f); 0 < iVar23; iVar23 = iVar23 + -1) {
        uVar3 = *(undefined8 *)((long)pfVar9 + lVar20 + 8);
        fVar30 = (float)*(undefined8 *)pfVar9;
        fVar31 = (float)((ulong)*(undefined8 *)pfVar9 >> 0x20);
        fVar33 = fVar30 - (float)uVar3;
        fVar32 = (float)((ulong)uVar3 >> 0x20);
        fVar34 = fVar31 - fVar32;
        pfVar9[1] = fVar32 + fVar31;
        *pfVar9 = fVar30 + *(float *)((long)pfVar9 + lVar20 + 8);
        *(ulong *)((long)pfVar9 + lVar20 + 8) =
             CONCAT44(fVar34 * fVar1 + -fVar33 * fVar2,fVar33 * fVar1 + fVar34 * fVar2);
        fVar30 = (float)*(undefined8 *)(pfVar9 + -2);
        fVar31 = (float)((ulong)*(undefined8 *)(pfVar9 + -2) >> 0x20);
        fVar33 = fVar30 - (float)*(undefined8 *)((long)pfVar9 + lVar20);
        fVar32 = (float)((ulong)*(undefined8 *)((long)pfVar9 + lVar20) >> 0x20);
        fVar34 = fVar31 - fVar32;
        pfVar9[-1] = fVar32 + fVar31;
        pfVar9[-2] = fVar30 + *(float *)((long)pfVar9 + lVar20);
        *(ulong *)((long)pfVar9 + lVar20) =
             CONCAT44(fVar34 * fVar28 + -fVar33 * fVar29,fVar33 * fVar28 + fVar34 * fVar29);
        uVar3 = *(undefined8 *)((long)pfVar9 + lVar20 + -8);
        fVar30 = (float)*(undefined8 *)(pfVar9 + -4);
        fVar31 = (float)((ulong)*(undefined8 *)(pfVar9 + -4) >> 0x20);
        fVar33 = fVar30 - (float)uVar3;
        fVar32 = (float)((ulong)uVar3 >> 0x20);
        fVar34 = fVar31 - fVar32;
        pfVar9[-3] = fVar32 + fVar31;
        pfVar9[-4] = fVar30 + *(float *)((long)pfVar9 + lVar20 + -8);
        *(ulong *)((long)pfVar9 + lVar20 + -8) =
             CONCAT44(fVar34 * fVar24 + -fVar33 * fVar26,fVar33 * fVar24 + fVar34 * fVar26);
        uVar3 = *(undefined8 *)((long)pfVar9 + lVar20 + -0x10);
        fVar30 = (float)*(undefined8 *)(pfVar9 + -6);
        fVar31 = (float)((ulong)*(undefined8 *)(pfVar9 + -6) >> 0x20);
        fVar33 = fVar30 - (float)uVar3;
        fVar32 = (float)((ulong)uVar3 >> 0x20);
        fVar34 = fVar31 - fVar32;
        pfVar9[-5] = fVar32 + fVar31;
        pfVar9[-6] = fVar30 + *(float *)((long)pfVar9 + lVar20 + -0x10);
        *(ulong *)((long)pfVar9 + lVar20 + -0x10) =
             CONCAT44(fVar34 * fVar27 + -fVar33 * fVar25,fVar33 * fVar27 + fVar34 * fVar25);
        pfVar9 = pfVar9 + -(long)iVar16;
      }
      pfVar14 = pfVar14 + ((int)uVar4 << (bVar6 & 0x1f));
      pfVar11 = pfVar11 + -8;
    }
    uVar19 = (ulong)((int)uVar19 + 1);
  }
  local_68 = ZEXT416(*(uint *)(local_68._0_8_ + (long)(int)local_78 * 4));
  pfVar14 = local_40 + local_44;
  pfVar11 = pfVar14 + local_84 * -0x10;
  for (; pfVar11 < pfVar14; pfVar14 = pfVar14 + -0x10) {
    fVar27 = pfVar14[-0xd];
    fVar25 = pfVar14[-1];
    fVar24 = *pfVar14;
    fVar26 = pfVar14[-3] - pfVar14[-0xb];
    fVar28 = pfVar14[-2] - pfVar14[-10];
    pfVar14[-3] = pfVar14[-3] + pfVar14[-0xb];
    pfVar14[-2] = pfVar14[-2] + pfVar14[-10];
    pfVar14[-1] = fVar25 + pfVar14[-9];
    *pfVar14 = fVar24 + pfVar14[-8];
    pfVar14[-0xb] = (float)local_68._0_4_ * (fVar26 - fVar28);
    pfVar14[-10] = (float)local_68._0_4_ * (fVar28 + fVar26);
    pfVar14[-9] = fVar25 - pfVar14[-9];
    pfVar14[-8] = fVar24 - pfVar14[-8];
    *(ulong *)(pfVar14 + -0xd) = CONCAT44(pfVar14[-5] - fVar27,pfVar14[-0xc] - pfVar14[-4]);
    fVar25 = pfVar14[-0xe] - pfVar14[-6];
    fVar24 = pfVar14[-7] - pfVar14[-0xf];
    pfVar14[-7] = pfVar14[-0xf] + pfVar14[-7];
    pfVar14[-6] = pfVar14[-0xe] + pfVar14[-6];
    pfVar14[-5] = fVar27 + pfVar14[-5];
    pfVar14[-4] = pfVar14[-0xc] + pfVar14[-4];
    pfVar14[-0xe] = (fVar25 + fVar24) * (float)local_68._0_4_;
    pfVar14[-0xf] = (fVar25 - fVar24) * (float)local_68._0_4_;
    pfVar17[-2] = 1.650239e-39;
    pfVar17[-1] = 0.0;
    iter_54(pfVar14);
    pfVar17[-2] = 1.650252e-39;
    pfVar17[-1] = 0.0;
    iter_54(pfVar14 + -8);
  }
  puVar12 = local_b0->bit_reverse[local_a8];
  pfVar11 = _a_off + (long)(int)local_50 + -1;
  for (pfVar14 = _a_off + local_a0 + -4; _a_off <= pfVar14; pfVar14 = pfVar14 + -4) {
    uVar19 = (ulong)*puVar12;
    *pfVar11 = local_40[uVar19];
    pfVar11[-1] = local_40[uVar19 + 1];
    pfVar14[3] = local_40[uVar19 + 2];
    pfVar14[2] = local_40[uVar19 + 3];
    uVar19 = (ulong)puVar12[1];
    pfVar11[-2] = local_40[uVar19];
    pfVar11[-3] = local_40[uVar19 + 1];
    pfVar14[1] = local_40[uVar19 + 2];
    *pfVar14 = local_40[uVar19 + 3];
    puVar12 = puVar12 + 2;
    pfVar11 = pfVar11 + -4;
  }
  pfVar9 = local_b0->C[local_a8] + 3;
  pfVar14 = _a_off + local_98;
  for (pfVar11 = _a_off; pfVar15 = pfVar14 + -4, pfVar11 < pfVar15; pfVar11 = pfVar11 + 4) {
    fVar24 = (float)*(undefined8 *)pfVar11;
    fVar25 = (float)((ulong)*(undefined8 *)pfVar11 >> 0x20);
    fVar27 = (float)*(undefined8 *)(pfVar14 + -2);
    fVar26 = fVar24 - fVar27;
    fVar29 = (float)((ulong)*(undefined8 *)(pfVar14 + -2) >> 0x20);
    fVar28 = fVar25 - fVar29;
    fVar24 = fVar24 + fVar27;
    fVar25 = fVar25 + fVar29;
    fVar27 = pfVar9[-2] * fVar26 + pfVar9[-3] * fVar25;
    fVar25 = pfVar9[-2] * fVar25 + -pfVar9[-3] * fVar26;
    *(ulong *)pfVar11 = CONCAT44(fVar28 + fVar25,fVar24 + fVar27);
    *(ulong *)(pfVar14 + -2) = CONCAT44(fVar25 - fVar28,fVar24 - fVar27);
    fVar24 = (float)*(undefined8 *)(pfVar11 + 2);
    fVar25 = (float)((ulong)*(undefined8 *)(pfVar11 + 2) >> 0x20);
    fVar27 = (float)*(undefined8 *)pfVar15;
    fVar26 = fVar24 - fVar27;
    fVar29 = (float)((ulong)*(undefined8 *)pfVar15 >> 0x20);
    fVar28 = fVar25 - fVar29;
    fVar24 = fVar24 + fVar27;
    fVar25 = fVar25 + fVar29;
    fVar27 = *pfVar9 * fVar26 + pfVar9[-1] * fVar25;
    fVar25 = *pfVar9 * fVar25 + -pfVar9[-1] * fVar26;
    *(ulong *)(pfVar11 + 2) = CONCAT44(fVar28 + fVar25,fVar24 + fVar27);
    *(ulong *)pfVar15 = CONCAT44(fVar25 - fVar28,fVar24 - fVar27);
    pfVar9 = pfVar9 + 4;
    pfVar14 = pfVar15;
  }
  lVar13 = (long)(int)local_50 * 4 + -4;
  lVar20 = local_98 * 4 + 0xc;
  lVar22 = (long)local_34 * 4 + -4;
  pfVar14 = local_b0->B[local_a8] + local_98 + -1;
  pfVar17[-2] = 1.68156e-44;
  pfVar17[-1] = 0.0;
  lVar8 = *(long *)(pfVar17 + -2);
  pfVar17 = _a_off + local_98;
  while (pfVar11 = pfVar17 + -8, _a_off <= pfVar11) {
    fVar25 = pfVar17[-2] * *pfVar14 - pfVar14[-1] * pfVar17[-1];
    fVar27 = -pfVar17[-2] * pfVar14[-1] - *pfVar14 * pfVar17[-1];
    *(float *)((long)local_40 + lVar8 + -0xc) = fVar25;
    *(float *)((long)local_40 + lVar13) = -fVar25;
    *(float *)((long)local_40 + lVar20 + -0xc) = fVar27;
    *(float *)((long)local_40 + lVar22) = fVar27;
    fVar25 = pfVar17[-4] * pfVar14[-2] - pfVar14[-3] * pfVar17[-3];
    fVar27 = -pfVar17[-4] * pfVar14[-3] - pfVar14[-2] * pfVar17[-3];
    *(float *)((long)local_40 + lVar8 + -8) = fVar25;
    *(float *)((long)local_40 + lVar13 + -4) = -fVar25;
    *(float *)((long)local_40 + lVar20 + -8) = fVar27;
    *(float *)((long)local_40 + lVar22 + -4) = fVar27;
    fVar25 = pfVar17[-6] * pfVar14[-4] - pfVar14[-5] * pfVar17[-5];
    fVar27 = -pfVar17[-6] * pfVar14[-5] - pfVar14[-4] * pfVar17[-5];
    *(float *)((long)local_40 + lVar8 + -4) = fVar25;
    *(float *)((long)local_40 + lVar13 + -8) = -fVar25;
    *(float *)((long)local_40 + lVar20 + -4) = fVar27;
    *(float *)((long)local_40 + lVar22 + -8) = fVar27;
    fVar25 = *pfVar11 * pfVar14[-6] - pfVar14[-7] * pfVar17[-7];
    fVar27 = -*pfVar11 * pfVar14[-7] - pfVar14[-6] * pfVar17[-7];
    *(float *)((long)local_40 + lVar8) = fVar25;
    *(float *)((long)local_40 + lVar13 + -0xc) = -fVar25;
    *(float *)((long)local_40 + lVar20) = fVar27;
    *(float *)((long)local_40 + lVar22 + -0xc) = fVar27;
    lVar8 = lVar8 + 0x10;
    lVar13 = lVar13 + -0x10;
    lVar20 = lVar20 + 0x10;
    lVar22 = lVar22 + -0x10;
    pfVar14 = pfVar14 + -8;
    pfVar17 = pfVar11;
  }
  local_b0->temp_offset = iVar16;
  return;
}

Assistant:

static void inverse_mdct(float *buffer, int n, vorb *f, int blocktype)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3, l;
   int ld;
   // @OPTIMIZE: reduce register pressure by using fewer variables?
   int save_point = temp_alloc_save(f);
   float *buf2 = (float *) temp_alloc(f, n2 * sizeof(*buf2));
   float *u=NULL,*v=NULL;
   // twiddle factors
   float *A = f->A[blocktype];

   // IMDCT algorithm from "The use of multirate filter banks for coding of high quality digital audio"
   // See notes about bugs in that paper in less-optimal implementation 'inverse_mdct_old' after this function.

   // kernel from paper


   // merged:
   //   copy and reflect spectral data
   //   step 0

   // note that it turns out that the items added together during
   // this step are, in fact, being added to themselves (as reflected
   // by step 0). inexplicable inefficiency! this became obvious
   // once I combined the passes.

   // so there's a missing 'times 2' here (for adding X to itself).
   // this propagates through linearly to the end, where the numbers
   // are 1/2 too small, and need to be compensated for.

   {
      float *d,*e, *AA, *e_stop;
      d = &buf2[n2-2];
      AA = A;
      e = &buffer[0];
      e_stop = &buffer[n2];
      while (e != e_stop) {
         d[1] = (e[0] * AA[0] - e[2]*AA[1]);
         d[0] = (e[0] * AA[1] + e[2]*AA[0]);
         d -= 2;
         AA += 2;
         e += 4;
      }

      e = &buffer[n2-3];
      while (d >= buf2) {
         d[1] = (-e[2] * AA[0] - -e[0]*AA[1]);
         d[0] = (-e[2] * AA[1] + -e[0]*AA[0]);
         d -= 2;
         AA += 2;
         e -= 4;
      }
   }

   // now we use symbolic names for these, so that we can
   // possibly swap their meaning as we change which operations
   // are in place

   u = buffer;
   v = buf2;

   // step 2    (paper output is w, now u)
   // this could be in place, but the data ends up in the wrong
   // place... _somebody_'s got to swap it, so this is nominated
   {
      float *AA = &A[n2-8];
      float *d0,*d1, *e0, *e1;

      e0 = &v[n4];
      e1 = &v[0];

      d0 = &u[n4];
      d1 = &u[0];

      while (AA >= A) {
         float v40_20, v41_21;

         v41_21 = e0[1] - e1[1];
         v40_20 = e0[0] - e1[0];
         d0[1]  = e0[1] + e1[1];
         d0[0]  = e0[0] + e1[0];
         d1[1]  = v41_21*AA[4] - v40_20*AA[5];
         d1[0]  = v40_20*AA[4] + v41_21*AA[5];

         v41_21 = e0[3] - e1[3];
         v40_20 = e0[2] - e1[2];
         d0[3]  = e0[3] + e1[3];
         d0[2]  = e0[2] + e1[2];
         d1[3]  = v41_21*AA[0] - v40_20*AA[1];
         d1[2]  = v40_20*AA[0] + v41_21*AA[1];

         AA -= 8;

         d0 += 4;
         d1 += 4;
         e0 += 4;
         e1 += 4;
      }
   }

   // step 3
   ld = ilog(n) - 1; // ilog is off-by-one from normal definitions

   // optimized step 3:

   // the original step3 loop can be nested r inside s or s inside r;
   // it's written originally as s inside r, but this is dumb when r
   // iterates many times, and s few. So I have two copies of it and
   // switch between them halfway.

   // this is iteration 0 of step 3
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*0, -(n >> 3), A);
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*1, -(n >> 3), A);

   // this is iteration 1 of step 3
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*0, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*1, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*2, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*3, -(n >> 4), A, 16);

   l=2;
   for (; l < (ld-3)>>1; ++l) {
      int k0 = n >> (l+2), k0_2 = k0>>1;
      int lim = 1 << (l+1);
      int i;
      for (i=0; i < lim; ++i)
         imdct_step3_inner_r_loop(n >> (l+4), u, n2-1 - k0*i, -k0_2, A, 1 << (l+3));
   }

   for (; l < ld-6; ++l) {
      int k0 = n >> (l+2), k1 = 1 << (l+3), k0_2 = k0>>1;
      int rlim = n >> (l+6), r;
      int lim = 1 << (l+1);
      int i_off;
      float *A0 = A;
      i_off = n2-1;
      for (r=rlim; r > 0; --r) {
         imdct_step3_inner_s_loop(lim, u, i_off, -k0_2, A0, k1, k0);
         A0 += k1*4;
         i_off -= 8;
      }
   }

   // iterations with count:
   //   ld-6,-5,-4 all interleaved together
   //       the big win comes from getting rid of needless flops
   //         due to the constants on pass 5 & 4 being all 1 and 0;
   //       combining them to be simultaneous to improve cache made little difference
   imdct_step3_inner_s_loop_ld654(n >> 5, u, n2-1, A, n);

   // output is u

   // step 4, 5, and 6
   // cannot be in-place because of step 5
   {
      uint16 *bitrev = f->bit_reverse[blocktype];
      // weirdly, I'd have thought reading sequentially and writing
      // erratically would have been better than vice-versa, but in
      // fact that's not what my testing showed. (That is, with
      // j = bitreverse(i), do you read i and write j, or read j and write i.)

      float *d0 = &v[n4-4];
      float *d1 = &v[n2-4];
      while (d0 >= v) {
         int k4;

         k4 = bitrev[0];
         d1[3] = u[k4+0];
         d1[2] = u[k4+1];
         d0[3] = u[k4+2];
         d0[2] = u[k4+3];

         k4 = bitrev[1];
         d1[1] = u[k4+0];
         d1[0] = u[k4+1];
         d0[1] = u[k4+2];
         d0[0] = u[k4+3];

         d0 -= 4;
         d1 -= 4;
         bitrev += 2;
      }
   }
   // (paper output is u, now v)


   // data must be in buf2
   assert(v == buf2);

   // step 7   (paper output is v, now v)
   // this is now in place
   {
      float *C = f->C[blocktype];
      float *d, *e;

      d = v;
      e = v + n2 - 4;

      while (d < e) {
         float a02,a11,b0,b1,b2,b3;

         a02 = d[0] - e[2];
         a11 = d[1] + e[3];

         b0 = C[1]*a02 + C[0]*a11;
         b1 = C[1]*a11 - C[0]*a02;

         b2 = d[0] + e[ 2];
         b3 = d[1] - e[ 3];

         d[0] = b2 + b0;
         d[1] = b3 + b1;
         e[2] = b2 - b0;
         e[3] = b1 - b3;

         a02 = d[2] - e[0];
         a11 = d[3] + e[1];

         b0 = C[3]*a02 + C[2]*a11;
         b1 = C[3]*a11 - C[2]*a02;

         b2 = d[2] + e[ 0];
         b3 = d[3] - e[ 1];

         d[2] = b2 + b0;
         d[3] = b3 + b1;
         e[0] = b2 - b0;
         e[1] = b1 - b3;

         C += 4;
         d += 4;
         e -= 4;
      }
   }

   // data must be in buf2


   // step 8+decode   (paper output is X, now buffer)
   // this generates pairs of data a la 8 and pushes them directly through
   // the decode kernel (pushing rather than pulling) to avoid having
   // to make another pass later

   // this cannot POSSIBLY be in place, so we refer to the buffers directly

   {
      float *d0,*d1,*d2,*d3;

      float *B = f->B[blocktype] + n2 - 8;
      float *e = buf2 + n2 - 8;
      d0 = &buffer[0];
      d1 = &buffer[n2-4];
      d2 = &buffer[n2];
      d3 = &buffer[n-4];
      while (e >= v) {
         float p0,p1,p2,p3;

         p3 =  e[6]*B[7] - e[7]*B[6];
         p2 = -e[6]*B[6] - e[7]*B[7];

         d0[0] =   p3;
         d1[3] = - p3;
         d2[0] =   p2;
         d3[3] =   p2;

         p1 =  e[4]*B[5] - e[5]*B[4];
         p0 = -e[4]*B[4] - e[5]*B[5];

         d0[1] =   p1;
         d1[2] = - p1;
         d2[1] =   p0;
         d3[2] =   p0;

         p3 =  e[2]*B[3] - e[3]*B[2];
         p2 = -e[2]*B[2] - e[3]*B[3];

         d0[2] =   p3;
         d1[1] = - p3;
         d2[2] =   p2;
         d3[1] =   p2;

         p1 =  e[0]*B[1] - e[1]*B[0];
         p0 = -e[0]*B[0] - e[1]*B[1];

         d0[3] =   p1;
         d1[0] = - p1;
         d2[3] =   p0;
         d3[0] =   p0;

         B -= 8;
         e -= 8;
         d0 += 4;
         d2 += 4;
         d1 -= 4;
         d3 -= 4;
      }
   }

   temp_free(f,buf2);
   temp_alloc_restore(f,save_point);
}